

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuMatrix.hpp
# Opt level: O3

Matrix<double,_3,_3> *
tcu::operator*(Matrix<double,_3,_3> *__return_storage_ptr__,Matrix<double,_3,_3> *mtx,double scalar)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  Matrix<double,_3,_3> *pMVar3;
  int col;
  long lVar4;
  int row_1;
  double *pdVar5;
  Matrix<double,_3,_3> *res;
  int row;
  long lVar6;
  long lVar7;
  undefined1 auVar8 [16];
  bool bVar10;
  undefined8 uVar11;
  long lVar9;
  
  pMVar3 = __return_storage_ptr__;
  (__return_storage_ptr__->m_data).m_data[2].m_data[0] = 0.0;
  (__return_storage_ptr__->m_data).m_data[2].m_data[1] = 0.0;
  (__return_storage_ptr__->m_data).m_data[1].m_data[1] = 0.0;
  (__return_storage_ptr__->m_data).m_data[1].m_data[2] = 0.0;
  (__return_storage_ptr__->m_data).m_data[0].m_data[2] = 0.0;
  (__return_storage_ptr__->m_data).m_data[1].m_data[0] = 0.0;
  (__return_storage_ptr__->m_data).m_data[0].m_data[0] = 0.0;
  (__return_storage_ptr__->m_data).m_data[0].m_data[1] = 0.0;
  (__return_storage_ptr__->m_data).m_data[2].m_data[2] = 0.0;
  auVar2 = _DAT_019f34d0;
  auVar1 = _DAT_019ec5b0;
  lVar4 = 0;
  lVar6 = 0;
  pdVar5 = (double *)__return_storage_ptr__;
  do {
    lVar7 = 0;
    auVar8 = auVar2;
    do {
      bVar10 = SUB164(auVar8 ^ auVar1,4) == -0x80000000 && SUB164(auVar8 ^ auVar1,0) < -0x7ffffffd;
      if (bVar10) {
        uVar11 = 0x3ff0000000000000;
        if (lVar4 != lVar7) {
          uVar11 = 0;
        }
        *(undefined8 *)((long)pdVar5 + lVar7) = uVar11;
      }
      if (bVar10) {
        uVar11 = 0x3ff0000000000000;
        if (lVar4 + -0x18 != lVar7) {
          uVar11 = 0;
        }
        *(undefined8 *)((long)pdVar5 + lVar7 + 0x18) = uVar11;
      }
      lVar9 = auVar8._8_8_;
      auVar8._0_8_ = auVar8._0_8_ + 2;
      auVar8._8_8_ = lVar9 + 2;
      lVar7 = lVar7 + 0x30;
    } while (lVar7 != 0x60);
    lVar6 = lVar6 + 1;
    lVar4 = lVar4 + 0x18;
    pdVar5 = pdVar5 + 1;
  } while (lVar6 != 3);
  lVar4 = 0;
  do {
    lVar6 = 0;
    do {
      ((Vector<tcu::Vector<double,_3>,_3> *)((Vector<double,_3> *)__return_storage_ptr__)->m_data)->
      m_data[0].m_data[lVar6] =
           ((Vector<tcu::Vector<double,_3>,_3> *)((Vector<double,_3> *)mtx)->m_data)->m_data[0].
           m_data[lVar6] * scalar;
      lVar6 = lVar6 + 1;
    } while (lVar6 != 3);
    lVar4 = lVar4 + 1;
    __return_storage_ptr__ = (Matrix<double,_3,_3> *)((long)__return_storage_ptr__ + 0x18);
    mtx = (Matrix<double,_3,_3> *)((long)mtx + 0x18);
  } while (lVar4 != 3);
  return pMVar3;
}

Assistant:

Matrix<T, Rows, Cols> operator* (const Matrix<T, Rows, Cols>& mtx, T scalar)
{
	Matrix<T, Rows, Cols> res;
	for (int col = 0; col < Cols; col++)
		for (int row = 0; row < Rows; row++)
			res(row, col) = mtx(row, col) * scalar;
	return res;
}